

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_keys_values.cpp
# Opt level: O0

ScalarFunction * duckdb::MapKeysFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  LogicalType *unaff_retaddr;
  FunctionStability in_stack_00000008;
  FunctionNullHandling in_stack_00000010;
  bind_lambda_function_t in_stack_00000018;
  ScalarFunction *function;
  BaseScalarFunction *function_00;
  BaseScalarFunction *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  LogicalTypeId in_stack_fffffffffffffe8f;
  LogicalType *in_stack_fffffffffffffe90;
  LogicalType *this_00;
  bind_scalar_function_extended_t in_stack_ffffffffffffff90;
  bind_scalar_function_t in_stack_ffffffffffffff98;
  scalar_function_t *in_stack_ffffffffffffffa0;
  LogicalType *in_stack_ffffffffffffffa8;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffb0;
  ScalarFunction *in_stack_ffffffffffffffb8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 uVar1;
  ScalarFunction *init_local_state;
  
  uVar1 = 0;
  init_local_state = in_RDI;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x2065228);
  LogicalType::LogicalType(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78
            );
  LogicalType::LogicalType(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f);
  this_00 = (LogicalType *)0x0;
  this = (BaseScalarFunction *)0x0;
  function_00 = (BaseScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (function_statistics_t)CONCAT17(uVar1,in_stack_fffffffffffffff0),
             (init_local_state_t)init_local_state,unaff_retaddr,in_stack_00000008,in_stack_00000010,
             in_stack_00000018);
  LogicalType::~LogicalType((LogicalType *)0x20652d2);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x20652df);
  LogicalType::~LogicalType((LogicalType *)0x20652ec);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x20652f9);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  BaseScalarFunction::SetReturnsError(function_00);
  BaseScalarFunction::~BaseScalarFunction(this);
  LogicalType::LogicalType(this_00,in_stack_fffffffffffffe8f);
  LogicalType::operator=((LogicalType *)this,(LogicalType *)function_00);
  LogicalType::~LogicalType((LogicalType *)0x2065349);
  return in_RDI;
}

Assistant:

ScalarFunction MapKeysFun::GetFunction() {
	//! the arguments and return types are actually set in the binder function
	ScalarFunction function({}, LogicalTypeId::LIST, MapKeysFunction, MapKeysBind);
	function.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(function);
	function.varargs = LogicalType::ANY;
	return function;
}